

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

int __thiscall
NNTreeImpl::compareKeyItem(NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *items,int idx)

{
  QPDF *qpdf;
  NNTreeDetails *pNVar1;
  bool bVar2;
  int iVar3;
  QPDFObjectHandle QVar4;
  byte local_d1;
  QPDFObjectHandle local_d0;
  QPDFObjectHandle local_c0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  byte local_39;
  QPDFObjectHandle local_38;
  int local_24;
  QPDFObjectHandle *pQStack_20;
  int idx_local;
  QPDFObjectHandle *items_local;
  QPDFObjectHandle *key_local;
  NNTreeImpl *this_local;
  
  local_24 = idx;
  pQStack_20 = items;
  items_local = key;
  key_local = (QPDFObjectHandle *)this;
  bVar2 = QPDFObjectHandle::isArray(items);
  local_39 = 0;
  local_d1 = 0;
  if (bVar2) {
    iVar3 = QPDFObjectHandle::getArrayNItems(pQStack_20);
    local_d1 = 0;
    if (iVar3 != local_24 * 2 && SBORROW4(iVar3,local_24 * 2) == iVar3 + local_24 * -2 < 0) {
      pNVar1 = this->details;
      QVar4 = QPDFObjectHandle::getArrayItem(&local_38,(int)pQStack_20);
      local_39 = 1;
      local_d1 = (**(code **)(*(long *)pNVar1 + 8))
                           (pNVar1,&local_38,
                            QVar4.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi);
    }
  }
  if ((local_39 & 1) != 0) {
    QPDFObjectHandle::~QPDFObjectHandle(&local_38);
  }
  if (((local_d1 ^ 0xff) & 1) != 0) {
    QTC::TC("qpdf","NNTree item is wrong type",0);
    qpdf = this->qpdf;
    std::__cxx11::to_string(&local_b0,local_24 * 2);
    std::operator+(&local_90,"item at index ",&local_b0);
    std::operator+(&local_70,&local_90," is not the right type");
    ::error(qpdf,&this->oh,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  pNVar1 = this->details;
  QPDFObjectHandle::QPDFObjectHandle(&local_c0,items_local);
  QPDFObjectHandle::getArrayItem(&local_d0,(int)pQStack_20);
  iVar3 = (**(code **)(*(long *)pNVar1 + 0x10))(pNVar1,&local_c0,&local_d0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_d0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c0);
  return iVar3;
}

Assistant:

int
NNTreeImpl::compareKeyItem(QPDFObjectHandle& key, QPDFObjectHandle& items, int idx)
{
    if (!((items.isArray() && (items.getArrayNItems() > (2 * idx)) &&
           details.keyValid(items.getArrayItem(2 * idx))))) {
        QTC::TC("qpdf", "NNTree item is wrong type");
        error(
            qpdf,
            this->oh,
            ("item at index " + std::to_string(2 * idx) + " is not the right type"));
    }
    return details.compareKeys(key, items.getArrayItem(2 * idx));
}